

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

void __thiscall sjtu::TrainManager::query_train(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  invalid_command *this_01;
  string *psVar4;
  long lVar5;
  pair<long,_bool> pVar6;
  long local_d8;
  char local_d0;
  string date;
  string trainID;
  string local_88;
  string local_68;
  hashType local_48;
  timeType local_40;
  
  trainID._M_dataplus._M_p = (pointer)&trainID.field_2;
  trainID._M_string_length = 0;
  date._M_dataplus._M_p = (pointer)&date.field_2;
  date._M_string_length = 0;
  lVar5 = 0;
  trainID.field_2._M_local_buf[0] = '\0';
  date.field_2._M_local_buf[0] = '\0';
  do {
    if (argc <= lVar5) {
      this_00 = this->TrainBpTree;
      std::__cxx11::string::string((string *)&local_68,(string *)&trainID);
      local_48 = StringHasher::operator()((StringHasher *)&this->field_0x10,&local_68);
      pVar6 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                        (this_00,&local_48);
      local_d8 = pVar6.first;
      local_d0 = pVar6.second;
      std::__cxx11::string::~string((string *)&local_68);
      if (pVar6.second == false) {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        iVar2 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base
                  [2])(this->TrainFile,&local_d8);
        std::__cxx11::string::string((string *)&local_88,(string *)&date);
        timeType::timeType(&local_40,&local_88);
        trainType::display((trainType *)CONCAT44(extraout_var,iVar2),&local_40);
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::__cxx11::string::~string((string *)&date);
      std::__cxx11::string::~string((string *)&trainID);
      return;
    }
    bVar1 = std::operator==(argv,"-i");
    psVar4 = &trainID;
    if (!bVar1) {
      bVar1 = std::operator==(argv,"-d");
      psVar4 = &date;
      if (!bVar1) {
        this_01 = (invalid_command *)__cxa_allocate_exception(0x68);
        invalid_command::invalid_command(this_01);
        __cxa_throw(this_01,&invalid_command::typeinfo,invalid_command::~invalid_command);
      }
    }
    std::__cxx11::string::_M_assign((string *)psVar4);
    lVar5 = lVar5 + 2;
    argv = argv + 2;
  } while( true );
}

Assistant:

void query_train(int argc , std::string *argv)
		{
			std::string trainID , date;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else TrainFile -> read(ret.first) -> display(timeType(date));
		}